

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::parseArgs(QPDFArgParser *this)

{
  option_table_t *poVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  *p_Var2;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  element_type *peVar6;
  long lVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  logic_error *this_00;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX_01;
  char *pcVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  bool bVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  char *__s;
  iterator unaff_R14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R15;
  bool bVar16;
  string message;
  string parameter;
  string arg_s;
  string o_arg;
  key_type local_130;
  key_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  key_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 local_3e;
  
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6->option_table = &peVar6->main_option_table;
  pcVar12 = "main";
  std::__cxx11::string::_M_replace
            ((ulong)&peVar6->option_table_name,0,
             (char *)(peVar6->option_table_name)._M_string_length,0x2654f8);
  checkCompletion(this);
  handleArgFileArguments(this);
  peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6->cur_arg = 1;
  if (1 < peVar6->argc) {
    pcVar12 = (char *)0x1;
    do {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      poVar1 = peVar6->option_table;
      pcVar12 = peVar6->argv[(int)pcVar12];
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,pcVar12,(allocator<char> *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,pcVar12,(allocator<char> *)&local_130);
      uVar4 = strcmp(pcVar12,"--");
      unaff_R15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)uVar4;
      if (uVar4 == 0) {
        p_Var2 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->option_table->_M_t;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"--","");
        unaff_R14 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(p_Var2,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)unaff_R14._M_node ==
            &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->option_table->_M_t)._M_impl.super__Rb_tree_header) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"QPDFArgParser: -- handler not registered");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        bVar16 = false;
        bVar15 = false;
      }
      else if ((*pcVar12 == '-') &&
              (iVar5 = strcmp(pcVar12,"-"), sVar3 = local_d0._M_string_length, iVar5 != 0)) {
        __s = pcVar12 + 1;
        if (pcVar12[1] == '-') {
          __s = pcVar12 + 2;
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar3,(ulong)__s);
        if ((char *)local_d0._M_string_length == (char *)0x0) {
          lVar7 = -1;
        }
        else {
          lVar7 = std::__cxx11::string::find((char)&local_d0,0x3d);
        }
        bVar16 = lVar7 != -1;
        if (bVar16) {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_d0);
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_d0);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
        unaff_R14._M_node = &(poVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
        peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((((peVar6->bash_completion == false) && (peVar6->argc == 2)) && (peVar6->cur_arg == 1))
           && (cVar9 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                       ::find(&(peVar6->help_option_table)._M_t,&local_d0),
              cVar9._M_node !=
              &(peVar6->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header)) {
          unaff_R14 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                      ::find(&(((this->m).
                                super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->help_option_table)._M_t,&local_d0);
          bVar15 = true;
        }
        else {
          bVar15 = false;
        }
        if (((!bVar15) && ((char *)local_d0._M_string_length != (char *)0x0)) &&
           (*local_d0._M_dataplus._M_p != '-')) {
          unaff_R14 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                      ::find(&((this->m).
                               super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->option_table->_M_t,&local_d0);
        }
      }
      else {
        p_Var2 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->option_table->_M_t;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
        unaff_R14 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(p_Var2,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar3 = local_110._M_string_length;
        strlen(pcVar12);
        bVar16 = false;
        std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar3,(ulong)pcVar12);
        bVar15 = false;
      }
      unaff_R12 = &local_110.field_2;
      if ((_Rb_tree_header *)unaff_R14._M_node ==
          &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->option_table->_M_t)._M_impl.super__Rb_tree_header) {
        std::operator+(&local_130,"unrecognized argument ",&local_70);
        peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar6->option_table != &peVar6->main_option_table) {
          std::operator+(&local_b0," (",&peVar6->option_table_name);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar10;
          psVar13 = (size_type *)(plVar10 + 2);
          if (local_f0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_e0._M_allocated_capacity = *psVar13;
            local_e0._8_8_ = plVar10[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0._M_allocated_capacity = *psVar13;
          }
          local_e8 = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        usage(this,&local_130);
LAB_0015fd1e:
        local_50 = &local_40;
        local_40 = 0x2d2d;
        local_48 = 2;
        local_3e = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_50,(ulong)local_d0._M_dataplus._M_p);
        local_90._M_dataplus._M_p = (pointer)*plVar10;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = plVar10[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
        }
        local_90._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0._M_dataplus._M_p = (pointer)*plVar10;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar10[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_110._M_dataplus._M_p);
        local_f0 = &local_e0;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10;
        pcVar12 = (char *)(plVar10 + 2);
        if (paVar14 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12) goto LAB_00160087;
        local_e0._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_e0._8_8_ = plVar10[3];
        goto LAB_00160094;
      }
      if (((undefined1)((char)unaff_R14._M_node[2]._M_color ^ _S_black | bVar16) != _S_black) ||
         ((bVar16 == true && unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0 &&
          (cVar8 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&unaff_R14._M_node[3]._M_parent,&local_110),
          cVar8._M_node == (_Base_ptr)&unaff_R14._M_node[3]._M_left)))) {
        std::operator+(&local_90,"--",&local_d0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
        unaff_R15 = &local_b0.field_2;
        local_b0._M_dataplus._M_p = (pointer)*plVar10;
        psVar13 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar10[3];
          local_b0._M_dataplus._M_p = (pointer)unaff_R15;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
        unaff_R12 = &local_e0;
        local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar10;
        psVar13 = (size_type *)(plVar10 + 2);
        if (local_f0 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_e0._M_allocated_capacity = *psVar13;
          local_e0._8_8_ = plVar10[3];
          local_f0 = unaff_R12;
        }
        else {
          local_e0._M_allocated_capacity = *psVar13;
        }
        local_e8 = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10;
        pcVar12 = (char *)(plVar10 + 2);
        if (paVar14 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12) goto LAB_0015ffaa;
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_130.field_2._8_8_ = plVar10[3];
        goto LAB_0015ffb7;
      }
      if (unaff_R14._M_node[5]._M_parent == (_Base_ptr)0x0) {
        if (unaff_R14._M_node[6]._M_parent != (_Base_ptr)0x0) {
          (*(code *)unaff_R14._M_node[6]._M_left)();
        }
      }
      else {
        if (bVar16 != false) goto LAB_0015fd1e;
        if (unaff_R14._M_node[5]._M_parent == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)unaff_R14._M_node[5]._M_left)();
      }
      if (bVar15) {
        exit(0);
      }
      if (uVar4 == 0) {
        peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar6->option_table = &peVar6->main_option_table;
        std::__cxx11::string::_M_replace
                  ((ulong)&peVar6->option_table_name,0,
                   (char *)(peVar6->option_table_name)._M_string_length,0x2654f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      peVar6 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar4 = peVar6->cur_arg + 1;
      pcVar12 = (char *)(ulong)uVar4;
      peVar6->cur_arg = uVar4;
    } while ((int)uVar4 < peVar6->argc);
  }
  if (peVar6->bash_completion != true) {
    doFinalChecks(this);
    return;
  }
  handleCompletion(this);
  plVar10 = extraout_RAX;
  paVar14 = extraout_RDX;
LAB_0015ffaa:
  local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
  local_130._M_dataplus._M_p = (pointer)paVar14;
LAB_0015ffb7:
  local_130._M_string_length = plVar10[1];
  *plVar10 = (long)pcVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_f0 != unaff_R12) {
    operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (unaff_R14._M_node[7]._M_parent == (_Base_ptr)0x0) {
    if (unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0) {
      std::__cxx11::string::append((char *)&local_130);
      p_Var11 = *(_Rb_tree_node_base **)(unaff_R14._M_node + 4);
      if (p_Var11 != (_Rb_tree_node_base *)&unaff_R14._M_node[3]._M_left) {
        bVar15 = true;
        do {
          if (bVar15) {
            bVar15 = false;
          }
          else {
            std::__cxx11::string::append((char *)&local_130);
          }
          std::__cxx11::string::_M_append((char *)&local_130,*(ulong *)(p_Var11 + 1));
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)&unaff_R14._M_node[3]._M_left);
      }
      std::__cxx11::string::append((char *)&local_130);
      goto LAB_00160079;
    }
    if (unaff_R14._M_node[2]._M_left != (_Base_ptr)0x0) {
      std::__cxx11::string::_M_append((char *)&local_130,(ulong)unaff_R14._M_node[2]._M_parent);
      goto LAB_00160079;
    }
  }
  else {
    (*(code *)unaff_R14._M_node[7]._M_left)(&unaff_R14._M_node[6]._M_right,&local_110);
  }
  std::__cxx11::string::append((char *)&local_130);
LAB_00160079:
  usage(this,&local_130);
  plVar10 = extraout_RAX_00;
  paVar14 = extraout_RDX_00;
LAB_00160087:
  local_e0._M_allocated_capacity = *(undefined8 *)pcVar12;
  local_f0 = paVar14;
LAB_00160094:
  local_e8 = plVar10[1];
  *plVar10 = (long)pcVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_130._M_dataplus._M_p = (pointer)*plVar10;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar13) {
    local_130.field_2._M_allocated_capacity = *psVar13;
    local_130.field_2._8_8_ = plVar10[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar13;
  }
  local_130._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  usage(this,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

void
QPDFArgParser::parseArgs()
{
    selectMainOptionTable();
    checkCompletion();
    handleArgFileArguments();
    for (m->cur_arg = 1; m->cur_arg < m->argc; ++m->cur_arg) {
        bool help_option = false;
        bool end_option = false;
        auto oep = m->option_table->end();
        char const* arg = m->argv[m->cur_arg];
        std::string parameter;
        bool have_parameter = false;
        std::string o_arg(arg);
        std::string arg_s(arg);
        if (strcmp(arg, "--") == 0) {
            // Special case for -- option, which is used to break out of subparsers.
            oep = m->option_table->find("--");
            end_option = true;
            if (oep == m->option_table->end()) {
                // This is registered automatically, so this can't happen.
                throw std::logic_error("QPDFArgParser: -- handler not registered");
            }
        } else if ((arg[0] == '-') && (strcmp(arg, "-") != 0)) {
            ++arg;
            if (arg[0] == '-') {
                // Be lax about -arg vs --arg
                ++arg;
            } else {
                QTC::TC("libtests", "QPDFArgParser single dash");
            }

            // Prevent --=something from being treated as an empty arg by searching for = from after
            // the first character. We do this since the empty string in the option table is for
            // positional arguments. Besides, it doesn't make sense to have an empty option.
            arg_s = arg;
            size_t equal_pos = std::string::npos;
            if (arg_s.length() > 0) {
                equal_pos = arg_s.find('=', 1);
            }
            if (equal_pos != std::string::npos) {
                have_parameter = true;
                parameter = arg_s.substr(equal_pos + 1);
                arg_s = arg_s.substr(0, equal_pos);
            }

            if ((!m->bash_completion) && (m->argc == 2) && (m->cur_arg == 1) &&
                m->help_option_table.count(arg_s)) {
                // Handle help option, which is only valid as the sole option.
                QTC::TC("libtests", "QPDFArgParser help option");
                oep = m->help_option_table.find(arg_s);
                help_option = true;
            }

            if (!(help_option || arg_s.empty() || (arg_s.at(0) == '-'))) {
                oep = m->option_table->find(arg_s);
            }
        } else {
            // The empty string maps to the positional argument handler.
            QTC::TC("libtests", "QPDFArgParser positional");
            oep = m->option_table->find("");
            parameter = arg;
        }

        if (oep == m->option_table->end()) {
            QTC::TC("libtests", "QPDFArgParser unrecognized");
            std::string message = "unrecognized argument " + o_arg;
            if (m->option_table != &m->main_option_table) {
                message += " (" + m->option_table_name + " options must be terminated with --)";
            }
            usage(message);
        }

        OptionEntry& oe = oep->second;
        if ((oe.parameter_needed && (!have_parameter)) ||
            ((!oe.choices.empty() && have_parameter && (0 == oe.choices.count(parameter))))) {
            std::string message = "--" + arg_s + " must be given as --" + arg_s + "=";
            if (oe.invalid_choice_handler) {
                oe.invalid_choice_handler(parameter);
                // Method should call usage() or exit. Just in case it doesn't...
                message += "option";
            } else if (!oe.choices.empty()) {
                QTC::TC("libtests", "QPDFArgParser required choices");
                message += "{";
                bool first = true;
                for (auto const& choice: oe.choices) {
                    if (first) {
                        first = false;
                    } else {
                        message += ",";
                    }
                    message += choice;
                }
                message += "}";
            } else if (!oe.parameter_name.empty()) {
                QTC::TC("libtests", "QPDFArgParser required parameter");
                message += oe.parameter_name;
            } else {
                // should not be possible
                message += "option";
            }
            usage(message);
        }

        if (oe.bare_arg_handler) {
            if (have_parameter) {
                usage(
                    "--"s + arg_s + " does not take a parameter, but \"" + parameter +
                    "\" was given");
            }
            oe.bare_arg_handler();
        } else if (oe.param_arg_handler) {
            oe.param_arg_handler(parameter);
        }
        if (help_option) {
            exit(0);
        }
        if (end_option) {
            selectMainOptionTable();
        }
    }
    if (m->bash_completion) {
        handleCompletion();
    } else {
        doFinalChecks();
    }
}